

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O0

size_t __thiscall adios2::VariableNT::StructFields(VariableNT *this)

{
  long *in_RDI;
  allocator *__rhs;
  allocator *__lhs;
  string local_120 [20];
  int in_stack_fffffffffffffef4;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  string *in_stack_ffffffffffffff68;
  VariableBase *in_stack_ffffffffffffff70;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [40];
  size_t local_8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"in call to VariableNT::StructFields",&local_31);
  helper::CheckForNullptr<adios2::core::VariableBase>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (*(int *)(*in_RDI + 0x28) != 0x10) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"bindings::CXX11",&local_69);
    __lhs = (allocator *)&stack0xffffffffffffff6f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff70,"VariableNT",__lhs);
    __rhs = &local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"StructFields",__rhs);
    adios2::ToString_abi_cxx11_((DataType)local_120);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)__rhs);
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  if (*(long *)(*in_RDI + 0x248) == 0) {
    local_8 = adios2::core::StructDefinition::Fields();
  }
  else {
    local_8 = adios2::core::StructDefinition::Fields();
  }
  return local_8;
}

Assistant:

size_t VariableNT::StructFields() const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::StructFields");
    if (m_Variable->m_Type != DataType::Struct)
    {
        helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "StructFields",
                                          "invalid data type " + ToString(m_Variable->m_Type) +
                                              ", only Struct type supports this API");
    }
    if (reinterpret_cast<core::VariableStruct *>(m_Variable)->m_ReadStructDefinition)
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_ReadStructDefinition->Fields();
    else
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_WriteStructDefinition->Fields();
}